

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall SQVM::NEG_OP(SQVM *this,SQObjectPtr *trg,SQObjectPtr *o)

{
  SQObjectType SVar1;
  long *plVar2;
  byte bVar3;
  bool bVar4;
  SQChar *pSVar5;
  undefined1 local_38 [8];
  SQObjectPtr closure;
  SQObjectPtr *o_local;
  SQObjectPtr *trg_local;
  SQVM *this_local;
  
  SVar1 = (o->super_SQObject)._type;
  closure.super_SQObject._unVal = (SQObjectValue)o;
  if (SVar1 == OT_INTEGER) {
    ::SQObjectPtr::operator=(trg,-(o->super_SQObject)._unVal.nInteger);
    this_local._7_1_ = 1;
  }
  else if (SVar1 == OT_FLOAT) {
    ::SQObjectPtr::operator=(trg,-(o->super_SQObject)._unVal.fFloat);
    this_local._7_1_ = 1;
  }
  else {
    if ((((SVar1 == OT_TABLE) || (SVar1 == OT_USERDATA)) || (SVar1 == OT_INSTANCE)) &&
       ((((o->super_SQObject)._unVal.pTable)->super_SQDelegable)._delegate != (SQTable *)0x0)) {
      ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_38);
      plVar2 = (long *)((closure.super_SQObject._unVal.pTable)->super_SQDelegable).
                       super_SQCollectable.super_SQRefCounted._uiRef;
      bVar3 = (**(code **)(*plVar2 + 0x30))(plVar2,this,4,(SQObjectPtr *)local_38);
      if ((bVar3 & 1) == 0) {
        bVar4 = false;
      }
      else {
        Push(this,(SQObjectPtr *)closure.super_SQObject._unVal.pTable);
        bVar4 = CallMetaMethod(this,(SQObjectPtr *)local_38,MT_UNM,1,&this->temp_reg);
        if (bVar4) {
          _Swap(&trg->super_SQObject,&(this->temp_reg).super_SQObject);
          this_local._7_1_ = 1;
          bVar4 = true;
        }
        else {
          this_local._7_1_ = 0;
          bVar4 = true;
        }
      }
      ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_38);
      if (bVar4) goto LAB_001c627e;
    }
    pSVar5 = GetTypeName((SQObjectPtr *)closure.super_SQObject._unVal.pTable);
    Raise_Error(this,"attempt to negate a %s",pSVar5);
    this_local._7_1_ = 0;
  }
LAB_001c627e:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool SQVM::NEG_OP(SQObjectPtr &trg,const SQObjectPtr &o)
{

    switch(sq_type(o)) {
    case OT_INTEGER:
        trg = -_integer(o);
        return true;
    case OT_FLOAT:
        trg = -_float(o);
        return true;
    case OT_TABLE:
    case OT_USERDATA:
    case OT_INSTANCE:
        if(_delegable(o)->_delegate) {
            SQObjectPtr closure;
            if(_delegable(o)->GetMetaMethod(this, MT_UNM, closure)) {
                Push(o);
                if(!CallMetaMethod(closure, MT_UNM, 1, temp_reg)) return false;
                _Swap(trg,temp_reg);
                return true;

            }
        }
    default:break; //shutup compiler
    }
    Raise_Error(_SC("attempt to negate a %s"), GetTypeName(o));
    return false;
}